

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O1

void testWithTranslateRotateAndScale<double>(M44d *m)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> from;
  Rand48 rand;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> to;
  vector<double,_std::allocator<double>_> weights;
  Vec3 *local_1a8;
  Vec3 *pVStack_1a0;
  long local_198;
  ushort local_186 [3];
  double local_180;
  double *local_178;
  undefined8 uStack_170;
  long local_168;
  vector<double,_std::allocator<double>_> local_158;
  double local_140;
  undefined1 local_138 [16];
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  Vec3<double> local_b8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing with known translate/rotate/scale matrix\n",0x31);
  Imath_2_5::operator<<((ostream *)&std::cout,m);
  local_186[0] = 0xd35a;
  local_186[1] = 0xc826;
  local_186[2] = 0xd35a;
  local_198 = 0;
  local_1a8 = (Vec3 *)0x0;
  pVStack_1a0 = (Vec3 *)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"numPoints: ",0xb);
  std::ostream::flush();
  lVar9 = 1;
  do {
    local_180 = (double)Imath_2_5::erand48(local_186);
    local_140 = (double)Imath_2_5::erand48(local_186);
    local_128 = (double)Imath_2_5::erand48(local_186);
    local_138._0_8_ = local_180;
    local_138._8_8_ = local_140;
    std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
    emplace_back<Imath_2_5::Vec3<double>>
              ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)&local_1a8
               ,(Vec3<double> *)local_138);
    local_138._0_8_ = Imath_2_5::erand48(local_186);
    if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_158,
                 (iterator)
                 local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)local_138);
    }
    else {
      *local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_138._0_8_;
      local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    local_178 = (double *)0x0;
    uStack_170 = 0;
    local_168 = 0;
    local_180 = (double)lVar9;
    if (pVStack_1a0 == local_1a8) {
      uVar8 = 0;
    }
    else {
      lVar9 = 0x10;
      uVar7 = 0;
      do {
        dVar10 = *(double *)(local_1a8 + lVar9 + -0x10);
        dVar2 = *(double *)(local_1a8 + lVar9 + -8);
        dVar3 = *(double *)(local_1a8 + lVar9);
        dVar15 = m->x[2][3] * dVar3 + m->x[0][3] * dVar10 + m->x[1][3] * dVar2 + m->x[3][3];
        local_128 = (m->x[2][2] * dVar3 + m->x[0][2] * dVar10 + m->x[1][2] * dVar2 + m->x[3][2]) /
                    dVar15;
        auVar11._0_8_ = dVar3 * m->x[2][0] + dVar10 * m->x[0][0] + m->x[1][0] * dVar2 + m->x[3][0];
        auVar11._8_8_ = dVar3 * m->x[2][1] + dVar10 * m->x[0][1] + m->x[1][1] * dVar2 + m->x[3][1];
        auVar13._8_8_ = dVar15;
        auVar13._0_8_ = dVar15;
        local_138 = divpd(auVar11,auVar13);
        std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
        emplace_back<Imath_2_5::Vec3<double>>
                  ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)
                   &local_178,(Vec3<double> *)local_138);
        uVar7 = uVar7 + 1;
        uVar8 = ((long)pVStack_1a0 - (long)local_1a8 >> 3) * -0x5555555555555555;
        lVar9 = lVar9 + 0x18;
      } while (uVar7 < uVar8);
    }
    Imath_2_5::procrustesRotationAndTranslation<double>
              ((Vec3 *)local_138,local_1a8,local_178,
               (ulong)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,SUB81(uVar8,0));
    if (pVStack_1a0 == local_1a8) {
      uVar8 = 0;
    }
    else {
      lVar9 = 0x10;
      uVar7 = 0;
      do {
        dVar10 = *(double *)(local_1a8 + lVar9 + -0x10);
        dVar2 = *(double *)(local_1a8 + lVar9 + -8);
        dVar3 = *(double *)(local_1a8 + lVar9);
        dVar15 = dStack_e0 * dVar3 + dStack_120 * dVar10 + dStack_100 * dVar2 + dStack_c0;
        local_b8.z = (local_e8 * dVar3 + local_128 * dVar10 + local_108 * dVar2 + local_c8) / dVar15
                     - *(double *)((long)local_178 + lVar9);
        auVar12._0_8_ =
             dVar3 * local_f8 + dVar10 * (double)local_138._0_8_ + dVar2 * local_118 + local_d8;
        auVar12._8_8_ =
             dVar3 * dStack_f0 + dVar10 * (double)local_138._8_8_ + dVar2 * dStack_110 + dStack_d0;
        auVar4._8_8_ = dVar15;
        auVar4._0_8_ = dVar15;
        auVar13 = divpd(auVar12,auVar4);
        pdVar1 = (double *)((long)local_178 + lVar9 + -0x10);
        local_b8.x = auVar13._0_8_ - *pdVar1;
        local_b8.y = auVar13._8_8_ - pdVar1[1];
        dVar10 = local_b8.z * local_b8.z + local_b8.x * local_b8.x + local_b8.y * local_b8.y;
        if (4.450147717014403e-308 <= dVar10) {
          if (dVar10 < 0.0) {
            dVar10 = sqrt(dVar10);
          }
          else {
            dVar10 = SQRT(dVar10);
          }
        }
        else {
          dVar10 = Imath_2_5::Vec3<double>::lengthTiny(&local_b8);
        }
        if (9.999999747378752e-05 <= dVar10) {
          __assert_fail("(from[i] * res - to[i]).length() < eps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                        ,0x75,
                        "void testWithTranslateRotateAndScale(const Imath_2_5::M44d &) [T = double]"
                       );
        }
        uVar7 = uVar7 + 1;
        uVar8 = ((long)pVStack_1a0 - (long)local_1a8 >> 3) * -0x5555555555555555;
        lVar9 = lVar9 + 0x18;
      } while (uVar7 < uVar8);
    }
    Imath_2_5::procrustesRotationAndTranslation<double>
              ((Vec3 *)&local_b8,local_1a8,(ulong)local_178,SUB81(uVar8,0));
    local_138._8_8_ = local_b8.y;
    local_138._0_8_ = local_b8.x;
    local_128 = local_b8.z;
    dStack_120 = dStack_a0;
    local_118 = local_98;
    dStack_110 = dStack_90;
    local_108 = local_88;
    dStack_100 = dStack_80;
    local_f8 = local_78;
    dStack_f0 = dStack_70;
    local_e8 = local_68;
    dStack_e0 = dStack_60;
    local_d8 = local_58;
    dStack_d0 = dStack_50;
    local_c8 = local_48;
    dStack_c0 = dStack_40;
    if (pVStack_1a0 != local_1a8) {
      lVar9 = 0x10;
      uVar8 = 0;
      do {
        dVar10 = *(double *)(local_1a8 + lVar9 + -0x10);
        dVar2 = *(double *)(local_1a8 + lVar9 + -8);
        dVar3 = *(double *)(local_1a8 + lVar9);
        dVar15 = dStack_e0 * dVar3 + dStack_120 * dVar10 + dStack_100 * dVar2 + dStack_c0;
        local_b8.z = (local_e8 * dVar3 + local_128 * dVar10 + local_108 * dVar2 + local_c8) / dVar15
                     - *(double *)((long)local_178 + lVar9);
        auVar14._0_8_ =
             dVar3 * local_f8 + dVar10 * (double)local_138._0_8_ + dVar2 * local_118 + local_d8;
        auVar14._8_8_ =
             dVar3 * dStack_f0 + dVar10 * (double)local_138._8_8_ + dVar2 * dStack_110 + dStack_d0;
        auVar5._8_8_ = dVar15;
        auVar5._0_8_ = dVar15;
        auVar13 = divpd(auVar14,auVar5);
        pdVar1 = (double *)((long)local_178 + lVar9 + -0x10);
        local_b8.x = auVar13._0_8_ - *pdVar1;
        local_b8.y = auVar13._8_8_ - pdVar1[1];
        dVar10 = local_b8.z * local_b8.z + local_b8.x * local_b8.x + local_b8.y * local_b8.y;
        if (4.450147717014403e-308 <= dVar10) {
          if (dVar10 < 0.0) {
            dVar10 = sqrt(dVar10);
          }
          else {
            dVar10 = SQRT(dVar10);
          }
        }
        else {
          dVar10 = Imath_2_5::Vec3<double>::lengthTiny(&local_b8);
        }
        if (9.999999747378752e-05 <= dVar10) {
          __assert_fail("(from[i] * res - to[i]).length() < eps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                        ,0x7a,
                        "void testWithTranslateRotateAndScale(const Imath_2_5::M44d &) [T = double]"
                       );
        }
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x18;
      } while (uVar8 < (ulong)(((long)pVStack_1a0 - (long)local_1a8 >> 3) * -0x5555555555555555));
    }
    dVar10 = local_180;
    if (local_178 != (double *)0x0) {
      operator_delete(local_178,local_168 - (long)local_178);
    }
    lVar9 = (long)dVar10 + 1;
    if (lVar9 == 10) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  OK\n",5);
      if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1a8 != (Vec3 *)0x0) {
        operator_delete(local_1a8,local_198 - (long)local_1a8);
      }
      return;
    }
  } while( true );
}

Assistant:

void testWithTranslateRotateAndScale (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing with known translate/rotate/scale matrix\n" << m;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand(5376);

    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> V3;
    std::vector<V3> from;
    std::vector<T> weights;

    const float eps = 1e-4;
    std::cout << "numPoints: " << std::flush;
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        from.push_back (V3(rand.nextf(), rand.nextf(), rand.nextf()));
        weights.push_back (rand.nextf());
        std::cout << from.size() << " ";

        std::vector<V3> to;
        for (size_t i = 0; i < from.size(); ++i)
            to.push_back (from[i] * m);

        // weighted:
        IMATH_INTERNAL_NAMESPACE::M44d res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], from.size(), true);
        for (size_t i = 0; i < from.size(); ++i)
            assert ((from[i] * res - to[i]).length() < eps);

        // unweighted:
        res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (&from[0], &to[0], from.size(), true);
        for (size_t i = 0; i < from.size(); ++i)
            assert ((from[i] * res - to[i]).length() < eps);
    }
    std::cout << "  OK\n";
}